

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::assign_helper(QString *this,char32_t *data,qsizetype len)

{
  Data *pDVar1;
  QArrayData *data_00;
  char16_t *pcVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  QUtf32 *pQVar5;
  DataEndianness in_R9D;
  QUtf32 *this_00;
  long in_FS_OFFSET;
  QByteArrayView in;
  State local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) || ((pDVar1->super_QArrayData).alloc < len * 2)) ||
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    fromUcs4((QString *)&local_48,data,len);
    data_00 = &((this->d).d)->super_QArrayData;
    pcVar2 = (this->d).ptr;
    (this->d).d = (Data *)local_48._0_8_;
    (this->d).ptr = (char16_t *)local_48.remainingChars;
    qVar3 = (this->d).size;
    (this->d).size = local_48.invalidChars;
    local_48._0_8_ = data_00;
    local_48.remainingChars = (qsizetype)pcVar2;
    local_48.invalidChars = qVar3;
    if (data_00 != (QArrayData *)0x0) {
      LOCK();
      (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
           (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data_00,2,0x10);
      }
    }
  }
  else {
    this_00 = (QUtf32 *)(this->d).ptr;
    pQVar5 = (QUtf32 *)((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
    if (pQVar5 != this_00) {
      (this->d).ptr = (char16_t *)pQVar5;
      this_00 = pQVar5;
    }
    local_48.field_4.d[1] = (void *)0x0;
    local_48.clearFn = (ClearDataFn)0x0;
    local_48.invalidChars = 0;
    local_48.field_4.d[0] = (void *)0x0;
    local_48._0_8_ = (QArrayData *)0x0;
    local_48.remainingChars = 0;
    in.m_data = (storage_type *)&local_48;
    in.m_size = (qsizetype)data;
    pQVar4 = QUtf32::convertToUnicode(this_00,(QChar *)(len << 2),in,(State *)0x0,in_R9D);
    (this->d).size = (long)pQVar4 - (long)this_00 >> 1;
    *(undefined2 *)((long)(this->d).ptr + ((long)pQVar4 - (long)this_00)) = 0;
    QStringConverterBase::State::clear(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::assign_helper(const char32_t *data, qsizetype len)
{
    // worst case: each char32_t requires a surrogate pair, so
    const auto requiredCapacity = len * 2;
    if (requiredCapacity <= capacity() && isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        auto begin = reinterpret_cast<QChar *>(d.begin());
        auto ba = QByteArrayView(reinterpret_cast<const std::byte*>(data), len * sizeof(char32_t));
        QStringConverter::State state;
        const auto end = QUtf32::convertToUnicode(begin, ba, &state, DetectEndianness);
        d.size = end - begin;
        d.data()[d.size] = u'\0';
    } else {
        *this = QString::fromUcs4(data, len);
    }
    return *this;
}